

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void nsync::nsync_waiter_free_(waiter *w)

{
  waiter *w_local;
  
  if ((w->flags & 2U) == 0) {
    uRam0000000000000000 = 0;
  }
  w->flags = w->flags & 0xfffffffd;
  if ((w->flags & 1U) == 0) {
    nsync_spin_test_and_set_((nsync_atomic_uint32_ *)&free_waiters_mu,1,1,0);
    free_waiters = nsync_dll_make_first_in_list_(free_waiters,&(w->nw).q);
    std::atomic_store_explicit<unsigned_int>
              ((atomic<unsigned_int> *)&free_waiters_mu,0,memory_order_release);
  }
  return;
}

Assistant:

void nsync_waiter_free_ (waiter *w) {
	ASSERT ((w->flags & WAITER_IN_USE) != 0);
	w->flags &= ~WAITER_IN_USE;
	if ((w->flags & WAITER_RESERVED) == 0) {
		nsync_spin_test_and_set_ (&free_waiters_mu, 1, 1, 0);
		free_waiters = nsync_dll_make_first_in_list_ (free_waiters, &w->nw.q);
		ATM_STORE_REL (&free_waiters_mu, 0); /* release store */
	}
}